

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O2

double __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_nullmutex>::log
          (ansicolor_sink<spdlog::details::console_nullmutex> *this,double __x)

{
  formatter *pfVar1;
  size_t start;
  long in_RSI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  memory_buf_t formatted;
  string_view_t local_140;
  memory_buf_t local_130;
  
  *(undefined8 *)(in_RSI + 0x28) = 0;
  *(undefined8 *)(in_RSI + 0x30) = 0;
  local_130.super_buffer<char>.ptr_ = local_130.store_;
  local_130.super_buffer<char>.size_ = 0;
  local_130.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_00149e40;
  local_130.super_buffer<char>.capacity_ = 0xfa;
  pfVar1 = (this->formatter_)._M_t.
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  (*pfVar1->_vptr_formatter[2])(pfVar1,in_RSI,&local_130);
  if ((this->should_do_colors_ == true) && (*(ulong *)(in_RSI + 0x28) < *(ulong *)(in_RSI + 0x30)))
  {
    print_range_(this,&local_130,0,*(ulong *)(in_RSI + 0x28));
    local_140.data_ = (this->colors_)._M_elems[*(uint *)(in_RSI + 0x10)]._M_dataplus._M_p;
    local_140.size_ = (this->colors_)._M_elems[*(uint *)(in_RSI + 0x10)]._M_string_length;
    print_ccode_(this,&local_140);
    print_range_(this,&local_130,*(size_t *)(in_RSI + 0x28),*(size_t *)(in_RSI + 0x30));
    print_ccode_(this,&this->reset);
    start = *(size_t *)(in_RSI + 0x30);
  }
  else {
    start = 0;
  }
  print_range_(this,&local_130,start,local_130.super_buffer<char>.size_);
  fflush((FILE *)this->target_file_);
  fmt::v7::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::deallocate(&local_130);
  return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::log(const details::log_msg &msg)
{
    // Wrap the originally formatted message in color codes.
    // If color is not supported in the terminal, log as is instead.
    std::lock_guard<mutex_t> lock(mutex_);
    msg.color_range_start = 0;
    msg.color_range_end = 0;
    memory_buf_t formatted;
    formatter_->format(msg, formatted);
    if (should_do_colors_ && msg.color_range_end > msg.color_range_start)
    {
        // before color range
        print_range_(formatted, 0, msg.color_range_start);
        // in color range
        print_ccode_(colors_[msg.level]);
        print_range_(formatted, msg.color_range_start, msg.color_range_end);
        print_ccode_(reset);
        // after color range
        print_range_(formatted, msg.color_range_end, formatted.size());
    }
    else // no color
    {
        print_range_(formatted, 0, formatted.size());
    }
    fflush(target_file_);
}